

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O2

int parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char examplestr [147];
  char helpstr [303];
  
  memcpy(helpstr,
         "Description: \n Using prunetree, the bifurcations in the decision trees which \n resulted in the minimum increase in likelihood are progressively \n removed and replaced by the parent node. The selection of the \n branches to be pruned out is done across the entire collection of \n decision trees globally."
         ,0x12f);
  memcpy(examplestr,
         "Example: \n\nprunetree \n  -itreedir input_tree_dir \n  -nseno 5000 \n  -otreedir output_tree_dir \n  -moddefn mdef \n  -psetfn questions \n  -minocc 100 "
         ,0x93);
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar2 != 0) {
    printf("%s\n\n",helpstr);
  }
  if ((int)lVar3 != 0) {
    printf("%s\n\n",examplestr);
  }
  if ((int)lVar3 == 0 && (int)lVar2 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/prunetree/parse_cmd_ln.c"
          ,0x8c,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

  const char helpstr[] =  
"Description: \n\
 Using prunetree, the bifurcations in the decision trees which \n\
 resulted in the minimum increase in likelihood are progressively \n\
 removed and replaced by the parent node. The selection of the \n\
 branches to be pruned out is done across the entire collection of \n\
 decision trees globally.";

  const char examplestr[] =  
"Example: \n\
\n\
prunetree \n\
  -itreedir input_tree_dir \n\
  -nseno 5000 \n\
  -otreedir output_tree_dir \n\
  -moddefn mdef \n\
  -psetfn questions \n\
  -minocc 100 ";

  static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-moddeffn",
	  ARG_STRING,
	  NULL,
	  "CI model definition file" },

	{ "-psetfn",
	  ARG_STRING,
	  NULL,
	  "Phone set definition file" },

	{ "-itreedir",
	  ARG_STRING,
	  NULL,
	  "Input tree directory" },
	{ "-otreedir",
	  ARG_STRING,
	  NULL,
	  "Output tree directory" },

	{ "-nseno",
	  ARG_INT32,
	  NULL,
	  "# of senones defined by the output trees"},

	{ "-minocc",
	  ARG_FLOAT32,
	  "0.0",
	  "Prune nodes w/ fewer than this # of observations"},

	{ "-allphones",
	  ARG_BOOLEAN,
	  "no",
	  "Prune a single tree for each state of all phones"},
	  
	{NULL, 0, NULL, NULL}
    };

    cmd_ln_parse(defn, argc, argv, 1);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }


    return 0;
}